

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5CreateAux(fts5_api *pApi,char *zName,void *pUserData,fts5_extension_function xFunc,
                 _func_void_void_ptr *xDestroy)

{
  size_t sVar1;
  _func_int_fts5_api_ptr_char_ptr_void_ptr_ptr_fts5_tokenizer_ptr *__s;
  sqlite3_int64 nByte;
  sqlite3_int64 nName;
  Fts5Auxiliary *pAux;
  int rc;
  Fts5Global *pGlobal;
  _func_void_void_ptr *xDestroy_local;
  fts5_extension_function xFunc_local;
  void *pUserData_local;
  char *zName_local;
  fts5_api *pApi_local;
  
  pAux._4_4_ = sqlite3_overload_function(*(sqlite3 **)(pApi + 1),zName,-1);
  if (pAux._4_4_ == 0) {
    sVar1 = strlen(zName);
    __s = (_func_int_fts5_api_ptr_char_ptr_void_ptr_ptr_fts5_tokenizer_ptr *)
          sqlite3_malloc64(sVar1 + 0x31);
    if (__s == (_func_int_fts5_api_ptr_char_ptr_void_ptr_ptr_fts5_tokenizer_ptr *)0x0) {
      pAux._4_4_ = 7;
    }
    else {
      memset(__s,0,sVar1 + 0x31);
      *(_func_int_fts5_api_ptr_char_ptr_void_ptr_ptr_fts5_tokenizer_ptr **)(__s + 8) = __s + 0x30;
      memcpy(*(void **)(__s + 8),zName,sVar1 + 1);
      *(fts5_api **)__s = pApi;
      *(void **)(__s + 0x10) = pUserData;
      *(fts5_extension_function *)(__s + 0x18) = xFunc;
      *(_func_void_void_ptr **)(__s + 0x20) = xDestroy;
      *(_func_int_fts5_api_ptr_char_ptr_void_ptr_ptr_fts5_tokenizer_ptr **)(__s + 0x28) =
           pApi[1].xFindTokenizer;
      pApi[1].xFindTokenizer = __s;
    }
  }
  return pAux._4_4_;
}

Assistant:

static int fts5CreateAux(
  fts5_api *pApi,                 /* Global context (one per db handle) */
  const char *zName,              /* Name of new function */
  void *pUserData,                /* User data for aux. function */
  fts5_extension_function xFunc,  /* Aux. function implementation */
  void(*xDestroy)(void*)          /* Destructor for pUserData */
){
  Fts5Global *pGlobal = (Fts5Global*)pApi;
  int rc = sqlite3_overload_function(pGlobal->db, zName, -1);
  if( rc==SQLITE_OK ){
    Fts5Auxiliary *pAux;
    sqlite3_int64 nName;            /* Size of zName in bytes, including \0 */
    sqlite3_int64 nByte;            /* Bytes of space to allocate */

    nName = strlen(zName) + 1;
    nByte = sizeof(Fts5Auxiliary) + nName;
    pAux = (Fts5Auxiliary*)sqlite3_malloc64(nByte);
    if( pAux ){
      memset(pAux, 0, (size_t)nByte);
      pAux->zFunc = (char*)&pAux[1];
      memcpy(pAux->zFunc, zName, nName);
      pAux->pGlobal = pGlobal;
      pAux->pUserData = pUserData;
      pAux->xFunc = xFunc;
      pAux->xDestroy = xDestroy;
      pAux->pNext = pGlobal->pAux;
      pGlobal->pAux = pAux;
    }else{
      rc = SQLITE_NOMEM;
    }
  }

  return rc;
}